

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FloatStateQueryVerifiers::GetFloatVerifier::verifyFloat4Color
          (GetFloatVerifier *this,TestContext *testCtx,GLenum name,GLfloat reference0,
          GLfloat reference1,GLfloat reference2,GLfloat reference3)

{
  GLfloat pname;
  bool bVar1;
  qpTestResult qVar2;
  float (*pafVar3) [4];
  TestLog *this_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_1e0;
  undefined1 local_5c [8];
  StateQueryMemoryWriteGuard<float[4]> floatVector4;
  GLfloat reference3_local;
  GLfloat reference2_local;
  GLfloat reference1_local;
  GLfloat reference0_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetFloatVerifier *this_local;
  
  floatVector4.m_postguard[2] = reference3;
  floatVector4.m_postguard[3] = reference2;
  reference3_local = reference1;
  reference2_local = reference0;
  reference1_local = (GLfloat)name;
  _reference0_local = testCtx;
  testCtx_local = (TestContext *)this;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<float[4]> *)local_5c);
  pname = reference1_local;
  pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_5c);
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_StateVerifier).super_CallLogWrapper,(GLenum)pname,*pafVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<float[4]> *)local_5c,_reference0_local);
  if (bVar1) {
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c);
    if (((*pafVar3)[0] == reference2_local) && (!NAN((*pafVar3)[0]) && !NAN(reference2_local))) {
      pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c);
      if (((*pafVar3)[1] == reference3_local) && (!NAN((*pafVar3)[1]) && !NAN(reference3_local))) {
        pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c);
        if (((*pafVar3)[2] == floatVector4.m_postguard[3]) &&
           (!NAN((*pafVar3)[2]) && !NAN(floatVector4.m_postguard[3]))) {
          pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c);
          if (((*pafVar3)[3] == floatVector4.m_postguard[2]) &&
             (!NAN((*pafVar3)[3]) && !NAN(floatVector4.m_postguard[2]))) {
            return;
          }
        }
      }
    }
    this_00 = tcu::TestContext::getLog(_reference0_local);
    tcu::TestLog::operator<<(&local_1e0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1e0,(char (*) [20])"// ERROR: expected ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&reference2_local);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&reference3_local);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,floatVector4.m_postguard + 3);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,floatVector4.m_postguard + 2);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])0x2b7cef6);
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*pafVar3);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*pafVar3 + 1);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*pafVar3 + 2);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_5c);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*pafVar3 + 3);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e0);
    qVar2 = tcu::TestContext::getTestResult(_reference0_local);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                (_reference0_local,QP_TEST_RESULT_FAIL,"Got invalid float value");
    }
  }
  return;
}

Assistant:

void GetFloatVerifier::verifyFloat4Color (tcu::TestContext& testCtx, GLenum name, GLfloat reference0, GLfloat reference1, GLfloat reference2, GLfloat reference3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[4]> floatVector4;
	glGetFloatv(name, floatVector4);

	if (!floatVector4.verifyValidity(testCtx))
		return;

	if (floatVector4[0] != reference0 ||
		floatVector4[1] != reference1 ||
		floatVector4[2] != reference2 ||
		floatVector4[3] != reference3)
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: expected "<< reference0 << ", " << reference1 << ", " << reference2 << ", " << reference3
			<< "; got " << floatVector4[0] << ", " << floatVector4[1] << ", " << floatVector4[2] << ", " << floatVector4[3]
			<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid float value");
	}
}